

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O3

void __thiscall calculator::SyntaxError::SyntaxError(SyntaxError *this,string *error)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  *(undefined ***)this = &PTR__SyntaxError_00118718;
  (this->error_msg)._M_dataplus._M_p = (pointer)&(this->error_msg).field_2;
  (this->error_msg)._M_string_length = 0;
  (this->error_msg).field_2._M_local_buf[0] = '\0';
  std::operator+(&local_40,"Error: ",error);
  std::__cxx11::string::operator=((string *)&this->error_msg,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

SyntaxError(const std::string& error = "") {
        error_msg = "Error: " + error;
    }